

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TracerFactoryTest.cpp
# Opt level: O3

void __thiscall
jaegertracing::TracerFactory_testWithoutReadFromEnv_Test::TestBody
          (TracerFactory_testWithoutReadFromEnv_Test *this)

{
  char cVar1;
  char *pcVar2;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  expected<std::shared_ptr<opentracing::v3::Tracer>,_std::error_code> tracerMaybe;
  string errorMessage;
  TracerFactory tracerFactory;
  long *local_a0;
  AssertHelper local_98 [8];
  Message local_90;
  undefined7 uStack_8f;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  AssertionResult local_80;
  undefined1 local_70 [16];
  byte local_60 [16];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  code *local_28;
  undefined1 local_20;
  
  setenv("JAEGER_SERVICE_NAME","AService",1);
  local_28 = jaegertracing::net::IPAddress::localIP;
  local_20 = 0;
  local_48._M_string_length = 0;
  local_48.field_2._M_local_buf[0] = '\0';
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  jaegertracing::TracerFactory::MakeTracer((char *)local_60,(string *)&local_28);
  local_90 = (Message)(local_60[0] ^ 1);
  local_88.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_60[0] == 1) {
    testing::Message::Message((Message *)&local_a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_80,(char *)&local_90,"tracerMaybe","true");
    testing::internal::AssertHelper::AssertHelper
              (local_98,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/TracerFactoryTest.cpp"
               ,0x54,(char *)CONCAT71(local_80._1_7_,local_80.success_));
    testing::internal::AssertHelper::operator=(local_98,(Message *)&local_a0);
    testing::internal::AssertHelper::~AssertHelper(local_98);
    if ((undefined1 *)CONCAT71(local_80._1_7_,local_80.success_) != local_70) {
      operator_delete((undefined1 *)CONCAT71(local_80._1_7_,local_80.success_));
    }
    if (local_a0 != (long *)0x0) {
      cVar1 = testing::internal::IsTrue(true);
      if ((cVar1 != '\0') && (local_a0 != (long *)0x0)) {
        (**(code **)(*local_a0 + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_88,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_88,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    pcVar2 = "";
    testing::internal::CmpHelperNE<std::__cxx11::string,char[1]>
              ((internal *)&local_80,"errorMessage","\"\"",&local_48,(char (*) [1])0x1e3f2c);
    if (local_80.success_ == false) {
      testing::Message::Message(&local_90);
      if (local_80.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = ((local_80.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_a0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/TracerFactoryTest.cpp"
                 ,0x55,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_a0,&local_90);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a0);
      if (CONCAT71(uStack_8f,local_90) != 0) {
        cVar1 = testing::internal::IsTrue(true);
        if ((cVar1 != '\0') && ((long *)CONCAT71(uStack_8f,local_90) != (long *)0x0)) {
          (**(code **)(*(long *)CONCAT71(uStack_8f,local_90) + 8))();
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_80.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_80.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      setenv("JAEGER_SERVICE_NAME","",1);
    }
  }
  if ((local_60[0] == 1) && (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return;
}

Assistant:

TEST(TracerFactory, testInvalidConfig)
{
    const char* invalidConfigTestCases[] = { "",
                                             "abc: {",
                                             R"({
      "service_name": {}
    })" };
    TracerFactory tracerFactory(true);
    for (auto&& invalidConfig : invalidConfigTestCases) {
        std::string errorMessage;
        auto tracerMaybe =
            tracerFactory.MakeTracer(invalidConfig, errorMessage);
        ASSERT_FALSE(tracerMaybe);
        ASSERT_NE(errorMessage, "");
    }
}